

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O3

void __thiscall
embree::ISPCGridMesh::ISPCGridMesh
          (ISPCGridMesh *this,RTCDevice device,TutorialScene *scene_in,
          Ref<embree::SceneGraph::GridMeshNode> *in)

{
  uint uVar1;
  RTCGeometry pRVar2;
  Vec3fa **ppVVar3;
  Vec3fa *pVVar4;
  GridMeshNode *pGVar5;
  Grid *pGVar6;
  pointer pvVar7;
  long lVar8;
  ulong uVar9;
  Ref<embree::SceneGraph::MaterialNode> local_30;
  
  (this->geom).type = GRID_MESH;
  (this->geom).geometry = (RTCGeometry)0x0;
  (this->geom).materialID = 0xffffffff;
  (this->geom).visited = false;
  this->positions = (Vec3fa **)0x0;
  pRVar2 = (RTCGeometry)rtcNewGeometry(device,2);
  (this->geom).geometry = pRVar2;
  ppVVar3 = (Vec3fa **)
            alignedUSMMalloc((long)(in->ptr->positions).
                                   super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(in->ptr->positions).
                                   super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 2,0x10,
                             DEVICE_READ_ONLY);
  this->positions = ppVVar3;
  pGVar5 = in->ptr;
  pvVar7 = (pGVar5->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((pGVar5->positions).
      super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar7) {
    lVar8 = 0;
    uVar9 = 0;
    do {
      pVVar4 = copyArrayToUSM<embree::Vec3fa>
                         ((avector<embree::Vec3fa> *)(&pvVar7->field_0x0 + lVar8));
      this->positions[uVar9] = pVVar4;
      uVar9 = uVar9 + 1;
      pGVar5 = in->ptr;
      pvVar7 = (pGVar5->positions).
               super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x20;
    } while (uVar9 < (ulong)((long)(pGVar5->positions).
                                   super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7 >> 5));
  }
  this->startTime = (pGVar5->time_range).lower;
  this->endTime = (in->ptr->time_range).upper;
  this->numTimeSteps =
       (uint)((ulong)((long)(in->ptr->positions).
                            super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(in->ptr->positions).
                           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 5);
  this->numVertices =
       (uint)((in->ptr->positions).
              super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->size_active;
  uVar1 = (*(in->ptr->super_Node).super_RefCount._vptr_RefCount[0xe])();
  this->numGrids = uVar1;
  local_30.ptr = (in->ptr->material).ptr;
  if (local_30.ptr != (MaterialNode *)0x0) {
    (*((local_30.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  uVar1 = TutorialScene::materialID(scene_in,&local_30);
  (this->geom).materialID = uVar1;
  if (local_30.ptr != (MaterialNode *)0x0) {
    (*((local_30.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  pGVar6 = copyArrayToUSM<embree::SceneGraph::GridMeshNode::Grid>(&in->ptr->grids);
  this->grids = (ISPCGrid *)pGVar6;
  return;
}

Assistant:

ISPCGridMesh::ISPCGridMesh (RTCDevice device, TutorialScene* scene_in, Ref<SceneGraph::GridMeshNode> in) 
    : geom(GRID_MESH), positions(nullptr)
  {
    geom.geometry = rtcNewGeometry (device, RTC_GEOMETRY_TYPE_GRID);
    
    positions = (Vec3fa**) alignedUSMMalloc(sizeof(Vec3fa*)*in->numTimeSteps());
    for (size_t i=0; i<in->numTimeSteps(); i++)
      positions[i] = copyArrayToUSM(in->positions[i]);

    startTime = in->time_range.lower;
    endTime   = in->time_range.upper;
    numTimeSteps = (unsigned) in->numTimeSteps();
    numVertices = (unsigned) in->numVertices();
    numGrids = (unsigned) in->numPrimitives();
    geom.materialID = scene_in->materialID(in->material);
    grids = (ISPCGrid*) copyArrayToUSM(in->grids);
  }